

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::remap_pls_variables(CompilerGLSL *this)

{
  StorageClass SVar1;
  pointer pPVar2;
  SPIRVariable *pSVar3;
  SPIRType *pSVar4;
  CompilerError *this_00;
  pointer pPVar5;
  bool bVar6;
  
  pPVar5 = (this->pls_inputs).
           super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl
           .super__Vector_impl_data._M_start;
  pPVar2 = (this->pls_inputs).
           super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl
           .super__Vector_impl_data._M_finish;
  do {
    if (pPVar5 == pPVar2) {
      pPVar5 = (this->pls_outputs).
               super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pPVar2 = (this->pls_outputs).
               super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      while( true ) {
        if (pPVar5 == pPVar2) {
          return;
        }
        pSVar3 = Compiler::get<spirv_cross::SPIRVariable>(&this->super_Compiler,pPVar5->id);
        if (pSVar3->storage != Output) break;
        pSVar3->remapped_variable = true;
        pPVar5 = pPVar5 + 1;
      }
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Can only use out variables for PLS outputs.");
LAB_00278d5d:
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    pSVar3 = Compiler::get<spirv_cross::SPIRVariable>(&this->super_Compiler,pPVar5->id);
    SVar1 = pSVar3->storage;
    if (SVar1 == StorageClassUniformConstant) {
      pSVar4 = Compiler::get<spirv_cross::SPIRType>
                         (&this->super_Compiler,*(uint32_t *)&(pSVar3->super_IVariant).field_0xc);
      bVar6 = (pSVar4->image).dim == DimSubpassData;
      SVar1 = pSVar3->storage;
    }
    else {
      bVar6 = false;
    }
    if ((SVar1 != Input) && (!bVar6)) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Can only use in and target variables for PLS inputs.");
      goto LAB_00278d5d;
    }
    pSVar3->remapped_variable = true;
    pPVar5 = pPVar5 + 1;
  } while( true );
}

Assistant:

void CompilerGLSL::remap_pls_variables()
{
	for (auto &input : pls_inputs)
	{
		auto &var = get<SPIRVariable>(input.id);

		bool input_is_target = false;
		if (var.storage == StorageClassUniformConstant)
		{
			auto &type = get<SPIRType>(var.basetype);
			input_is_target = type.image.dim == DimSubpassData;
		}

		if (var.storage != StorageClassInput && !input_is_target)
			SPIRV_CROSS_THROW("Can only use in and target variables for PLS inputs.");
		var.remapped_variable = true;
	}

	for (auto &output : pls_outputs)
	{
		auto &var = get<SPIRVariable>(output.id);
		if (var.storage != StorageClassOutput)
			SPIRV_CROSS_THROW("Can only use out variables for PLS outputs.");
		var.remapped_variable = true;
	}
}